

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

scalar __thiscall
absl::make_unique<s2builderutil::S2PolylineLayer,S2Polyline*&>(absl *this,S2Polyline **args)

{
  S2PolylineLayer *this_00;
  Options local_20;
  
  this_00 = (S2PolylineLayer *)operator_new(0x28);
  local_20.edge_type_ = DIRECTED;
  local_20.validate_ = false;
  s2builderutil::S2PolylineLayer::S2PolylineLayer(this_00,*args,&local_20);
  *(S2PolylineLayer **)this = this_00;
  return (__uniq_ptr_data<s2builderutil::S2PolylineLayer,_std::default_delete<s2builderutil::S2PolylineLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::S2PolylineLayer,_std::default_delete<s2builderutil::S2PolylineLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}